

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void __thiscall
fmt::v8::detail::format_dragon
          (detail *this,fp value,bool is_predecessor_closer,int num_digits,buffer<char> *buf,
          int *exp10)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  type tVar4;
  uint uVar5;
  undefined7 in_register_00000009;
  uint64_t value_00;
  undefined4 in_register_00000084;
  buffer<char> *this_00;
  ulong uVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  bigint *local_328;
  char digit;
  buffer<char> *local_318;
  int local_30c;
  char *local_308;
  ulong local_300;
  bigint *local_2f8;
  bigint denominator;
  bigint numerator;
  bigint lower;
  bigint upper_store;
  ulong uVar10;
  
  this_00 = (buffer<char> *)CONCAT44(in_register_00000084,num_digits);
  numerator.bigits_.super_buffer<unsigned_int>.size_ = 0;
  numerator.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_0012eca8;
  numerator.bigits_.super_buffer<unsigned_int>.ptr_ = numerator.bigits_.store_;
  numerator.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  numerator.exp_ = 0;
  denominator.bigits_.super_buffer<unsigned_int>.size_ = 0;
  denominator.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_0012eca8;
  denominator.bigits_.super_buffer<unsigned_int>.ptr_ = denominator.bigits_.store_;
  denominator.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  denominator.exp_ = 0;
  lower.bigits_.super_buffer<unsigned_int>.size_ = 0;
  iVar3 = (int)value.f;
  lower.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_0012eca8;
  lower.bigits_.super_buffer<unsigned_int>.ptr_ = lower.bigits_.store_;
  lower.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  lower.exp_ = 0;
  local_328 = &upper_store;
  upper_store.bigits_.super_buffer<unsigned_int>.size_ = 0;
  upper_store.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_0012eca8;
  upper_store.bigits_.super_buffer<unsigned_int>.ptr_ = upper_store.bigits_.store_;
  upper_store.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  upper_store.exp_ = 0;
  iVar7 = value.e + 1;
  value_00 = (long)this << ((byte)iVar7 & 0x3f);
  cVar2 = (char)value.e;
  local_318 = buf;
  if (iVar3 < 0) {
    if (*(int *)&buf->_vptr_buffer < 0) {
      bigint::assign_pow10(&numerator,-*(int *)&buf->_vptr_buffer);
      bigint::assign(&lower,&numerator);
      if (cVar2 == '\0') {
        local_328 = (bigint *)0x0;
      }
      else {
        local_328 = &upper_store;
        bigint::assign(local_328,&numerator);
        bigint::operator<<=(&upper_store,1);
      }
      bigint::operator*=(&numerator,value_00);
      bigint::assign(&denominator,1);
      bigint::operator<<=(&denominator,iVar7 - iVar3);
    }
    else {
      bigint::assign(&numerator,value_00);
      bigint::assign_pow10(&denominator,*(int *)&local_318->_vptr_buffer);
      bigint::operator<<=(&denominator,iVar7 - iVar3);
      bigint::assign(&lower,1);
      if (cVar2 == '\0') {
        local_328 = (bigint *)0x0;
      }
      else {
        bigint::assign(&upper_store,2);
      }
    }
  }
  else {
    bigint::assign(&numerator,value_00);
    bigint::operator<<=(&numerator,iVar3);
    bigint::assign(&lower,1);
    bigint::operator<<=(&lower,iVar3);
    if (cVar2 == '\0') {
      local_328 = (bigint *)0x0;
    }
    else {
      local_328 = &upper_store;
      bigint::assign(local_328,1);
      bigint::operator<<=(&upper_store,iVar3 + 1);
    }
    bigint::assign_pow10(&denominator,*(int *)&local_318->_vptr_buffer);
    bigint::operator<<=(&denominator,iVar7);
  }
  iVar3 = (int)CONCAT71(in_register_00000009,is_predecessor_closer);
  if (-1 < iVar3) {
    *(int *)&local_318->_vptr_buffer = *(int *)&local_318->_vptr_buffer - (iVar3 + -1);
    uVar9 = iVar3 - 1;
    uVar10 = (ulong)uVar9;
    if (iVar3 == 0) {
      bigint::multiply(&denominator,10);
      iVar3 = add_compare(&numerator,&numerator,&denominator);
      digit = 0 < iVar3 | 0x30;
      buffer<char>::push_back(this_00,&digit);
    }
    else {
      tVar4 = to_unsigned<int>(iVar3);
      buffer<char>::try_resize(this_00,(ulong)tVar4);
      for (uVar6 = 0; uVar10 != uVar6; uVar6 = uVar6 + 1) {
        iVar3 = bigint::divmod_assign(&numerator,&denominator);
        this_00->ptr_[uVar6] = (char)iVar3 + '0';
        bigint::multiply(&numerator,10);
      }
      uVar5 = bigint::divmod_assign(&numerator,&denominator);
      iVar3 = add_compare(&numerator,&numerator,&denominator);
      if ((0 < iVar3) || ((uVar5 & 1) != 0 && iVar3 == 0)) {
        if (uVar5 == 9) {
          this_00->ptr_[(int)uVar9] = ':';
          while( true ) {
            pcVar1 = this_00->ptr_;
            if (((int)uVar10 < 1) || (pcVar1[uVar10] != ':')) break;
            pcVar1[uVar10] = '0';
            uVar10 = (ulong)((int)uVar10 - 1);
            this_00->ptr_[uVar10] = this_00->ptr_[uVar10] + '\x01';
          }
          if (*pcVar1 == ':') {
            *pcVar1 = '1';
            *(int *)&local_318->_vptr_buffer = *(int *)&local_318->_vptr_buffer + 1;
          }
          goto LAB_0011ab36;
        }
        uVar5 = uVar5 + 1;
      }
      this_00->ptr_[(int)uVar9] = (char)uVar5 + '0';
    }
    goto LAB_0011ab36;
  }
  local_2f8 = local_328;
  if (local_328 == (bigint *)0x0) {
    local_2f8 = &lower;
  }
  local_308 = this_00->ptr_;
  uVar9 = ~(uint)this & 1;
  local_300 = (ulong)uVar9;
  local_30c = -uVar9;
  lVar8 = 0;
  while( true ) {
    uVar9 = bigint::divmod_assign(&numerator,&denominator);
    iVar3 = compare(&numerator,&lower);
    iVar7 = add_compare(&numerator,local_2f8,&denominator);
    local_308[lVar8] = (char)uVar9 + '0';
    if ((iVar3 < (int)local_300) || (local_30c < iVar7)) break;
    bigint::multiply(&numerator,10);
    bigint::multiply(&lower,10);
    if (local_328 != (bigint *)0x0) {
      bigint::multiply(local_328,10);
    }
    lVar8 = lVar8 + 1;
  }
  if (iVar3 < (int)local_300) {
    if (local_30c < iVar7) {
      iVar3 = add_compare(&numerator,&numerator,&denominator);
      if ((0 < iVar3) || ((uVar9 & 1) != 0 && iVar3 == 0)) {
        cVar2 = local_308[lVar8] + '\x01';
        goto LAB_0011aa90;
      }
    }
  }
  else {
    cVar2 = (char)uVar9 + '1';
LAB_0011aa90:
    local_308[lVar8] = cVar2;
  }
  tVar4 = to_unsigned<int>((int)lVar8 + 1);
  buffer<char>::try_resize(this_00,(ulong)tVar4);
  *(int *)&local_318->_vptr_buffer = *(int *)&local_318->_vptr_buffer - (int)lVar8;
LAB_0011ab36:
  bigint::~bigint(&upper_store);
  bigint::~bigint(&lower);
  bigint::~bigint(&denominator);
  bigint::~bigint(&numerator);
  return;
}

Assistant:

FMT_CONSTEXPR20 inline void format_dragon(fp value, bool is_predecessor_closer,
                                          int num_digits, buffer<char>& buf,
                                          int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  int shift = is_predecessor_closer ? 2 : 1;
  uint64_t significand = value.f << shift;
  if (value.e >= 0) {
    numerator.assign(significand);
    numerator <<= value.e;
    lower.assign(1);
    lower <<= value.e;
    if (shift != 1) {
      upper_store.assign(1);
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= shift;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (shift != 1) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= significand;
    denominator.assign(1);
    denominator <<= shift - value.e;
  } else {
    numerator.assign(significand);
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower.assign(1);
    if (shift != 1) {
      upper_store.assign(1ULL << 1);
      upper = &upper_store;
    }
  }
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  if (num_digits < 0) {
    // Generate the shortest representation.
    if (!upper) upper = &lower;
    bool even = (value.f & 1) == 0;
    num_digits = 0;
    char* data = buf.data();
    for (;;) {
      int digit = numerator.divmod_assign(denominator);
      bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
      // numerator + upper >[=] pow10:
      bool high = add_compare(numerator, *upper, denominator) + even > 0;
      data[num_digits++] = static_cast<char>('0' + digit);
      if (low || high) {
        if (!low) {
          ++data[num_digits - 1];
        } else if (high) {
          int result = add_compare(numerator, numerator, denominator);
          // Round half to even.
          if (result > 0 || (result == 0 && (digit % 2) != 0))
            ++data[num_digits - 1];
        }
        buf.try_resize(to_unsigned(num_digits));
        exp10 -= num_digits - 1;
        return;
      }
      numerator *= 10;
      lower *= 10;
      if (upper != &lower) *upper *= 10;
    }
  }
  // Generate the given number of digits.
  exp10 -= num_digits - 1;
  if (num_digits == 0) {
    denominator *= 10;
    auto digit = add_compare(numerator, numerator, denominator) > 0 ? '1' : '0';
    buf.push_back(digit);
    return;
  }
  buf.try_resize(to_unsigned(num_digits));
  for (int i = 0; i < num_digits - 1; ++i) {
    int digit = numerator.divmod_assign(denominator);
    buf[i] = static_cast<char>('0' + digit);
    numerator *= 10;
  }
  int digit = numerator.divmod_assign(denominator);
  auto result = add_compare(numerator, numerator, denominator);
  if (result > 0 || (result == 0 && (digit % 2) != 0)) {
    if (digit == 9) {
      const auto overflow = '0' + 10;
      buf[num_digits - 1] = overflow;
      // Propagate the carry.
      for (int i = num_digits - 1; i > 0 && buf[i] == overflow; --i) {
        buf[i] = '0';
        ++buf[i - 1];
      }
      if (buf[0] == overflow) {
        buf[0] = '1';
        ++exp10;
      }
      return;
    }
    ++digit;
  }
  buf[num_digits - 1] = static_cast<char>('0' + digit);
}